

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.h
# Opt level: O1

void __thiscall
ASDCP::MXF::FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>::Dump
          (FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_> *this,
          FILE *stream,ui32_t depth)

{
  undefined8 uVar1;
  pointer pUVar2;
  char identbuf [128];
  char acStack_a8 [128];
  
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  pUVar2 = (this->super_vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>).
           super__Vector_base<Kumu::UUID,_std::allocator<Kumu::UUID>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pUVar2 != (this->super_vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>).
                super__Vector_base<Kumu::UUID,_std::allocator<Kumu::UUID>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      uVar1 = Kumu::bin2UUIDhex((pUVar2->super_Identifier<16U>).m_Value,0x10,acStack_a8,0x80);
      fprintf((FILE *)stream,"  %s\n",uVar1);
      pUVar2 = pUVar2 + 1;
    } while (pUVar2 != (this->super_vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>).
                       super__Vector_base<Kumu::UUID,_std::allocator<Kumu::UUID>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void Dump(FILE* stream = 0, ui32_t depth = 0) {
	    (void) depth;
	    char identbuf[IdentBufferLen];

	    if ( stream == 0 )
	      {
		stream = stderr;
	      }
	    
	    typename ContainerType::const_iterator i;
	    for ( i = this->begin(); i != this->end(); ++i )
	      {
		fprintf(stream, "  %s\n", (*i).EncodeString(identbuf, IdentBufferLen));
	      }
	  }